

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::computeOptimizationHints(SchemaLoader *this)

{
  kj::_::Mutex::lock();
  Impl::computeOptimizationHints((this->impl).value.ptr);
  if (this != (SchemaLoader *)0x0) {
    kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

void SchemaLoader::computeOptimizationHints() {
  impl.lockExclusive()->get()->computeOptimizationHints();
}